

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XInclude.cpp
# Opt level: O0

bool __thiscall XIncludeErrorHandler::handleError(XIncludeErrorHandler *this,DOMError *domError)

{
  int iVar1;
  long *plVar2;
  XMLCh *pXVar3;
  ostream *poVar4;
  ulong uVar5;
  StrX local_40 [3];
  StrX local_28;
  byte local_19;
  DOMError *pDStack_18;
  bool continueParsing;
  DOMError *domError_local;
  XIncludeErrorHandler *this_local;
  
  local_19 = 1;
  pDStack_18 = domError;
  domError_local = (DOMError *)this;
  iVar1 = (**(code **)(*(long *)domError + 0x10))();
  if (iVar1 == 1) {
    std::operator<<((ostream *)&std::cerr,"\nWarning at file ");
  }
  else {
    iVar1 = (**(code **)(*(long *)pDStack_18 + 0x10))();
    if (iVar1 == 2) {
      std::operator<<((ostream *)&std::cerr,"\nError at file ");
      this->fSawErrors = true;
    }
    else {
      std::operator<<((ostream *)&std::cerr,"\nFatal Error at file ");
      local_19 = 0;
      this->fSawErrors = true;
    }
  }
  plVar2 = (long *)(**(code **)(*(long *)pDStack_18 + 0x20))();
  pXVar3 = (XMLCh *)(**(code **)(*plVar2 + 0x38))();
  StrX::StrX(&local_28,pXVar3);
  poVar4 = operator<<((ostream *)&std::cerr,&local_28);
  poVar4 = std::operator<<(poVar4,", line ");
  plVar2 = (long *)(**(code **)(*(long *)pDStack_18 + 0x20))();
  uVar5 = (**(code **)(*plVar2 + 0x10))();
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar5);
  poVar4 = std::operator<<(poVar4,", char ");
  plVar2 = (long *)(**(code **)(*(long *)pDStack_18 + 0x20))();
  uVar5 = (**(code **)(*plVar2 + 0x18))();
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar5);
  poVar4 = std::operator<<(poVar4,"\n  Message: ");
  pXVar3 = (XMLCh *)(**(code **)(*(long *)pDStack_18 + 0x18))();
  StrX::StrX(local_40,pXVar3);
  poVar4 = operator<<(poVar4,local_40);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  StrX::~StrX(local_40);
  StrX::~StrX(&local_28);
  return (bool)(local_19 & 1);
}

Assistant:

bool XIncludeErrorHandler::handleError(const DOMError& domError)
{
	bool continueParsing = true;
    if (domError.getSeverity() == DOMError::DOM_SEVERITY_WARNING)
        std::cerr << "\nWarning at file ";
    else if (domError.getSeverity() == DOMError::DOM_SEVERITY_ERROR)
    {
        std::cerr << "\nError at file ";
        fSawErrors = true;
    }
	else {
        std::cerr << "\nFatal Error at file ";
		continueParsing = false;
        fSawErrors = true;
	}

    std::cerr << StrX(domError.getLocation()->getURI())
         << ", line " << domError.getLocation()->getLineNumber()
         << ", char " << domError.getLocation()->getColumnNumber()
         << "\n  Message: " << StrX(domError.getMessage()) << std::endl;

    return continueParsing;
}